

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
DescriptorKeyInfo_GetExtPrivkeyInformation_Test::TestBody
          (DescriptorKeyInfo_GetExtPrivkeyInformation_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper AStack_168;
  AssertionResult gtest_ar;
  string local_140;
  string key_str;
  string ext_path_str;
  string ext_str;
  string path;
  string extkey;
  ExtPrivkey privkey;
  
  std::__cxx11::string::string
            ((string *)&extkey,
             "tprv8fFXTTUs3e5Q1CGAPnabXXFUJor2q2jXo3VCceUggUNGMgCQ4FsLgPemcq2FPym15qZ2kjNx414T3Ypha1gAL3GHUH3uN3xDB3ymD434uWh"
             ,(allocator *)&privkey);
  cfd::core::ExtPrivkey::ExtPrivkey(&privkey,&extkey);
  std::__cxx11::string::string((string *)&path,"0\'/1",(allocator *)&ext_str);
  std::__cxx11::string::string((string *)&ext_str,"[f4a831a2]",(allocator *)&ext_path_str);
  std::operator+(&key_str,"[f4a831a2/",&path);
  std::operator+(&ext_path_str,&key_str,"]");
  std::__cxx11::string::~string((string *)&key_str);
  key_str._M_dataplus._M_p = (pointer)&key_str.field_2;
  key_str._M_string_length = 0;
  key_str.field_2._M_local_buf[0] = '\0';
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_140,"",(allocator *)&AStack_168);
      cfd::core::DescriptorKeyInfo::GetExtPrivkeyInformation
                ((string *)&gtest_ar,&privkey,&local_140);
      std::__cxx11::string::operator=((string *)&key_str,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&local_140);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5e0,
               "Expected: key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, \"\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"key_str.c_str()","ext_str.c_str()",key_str._M_dataplus._M_p,
             ext_str._M_dataplus._M_p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_140);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5e1,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_140);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::GetExtPrivkeyInformation((string *)&gtest_ar,&privkey,&path);
      std::__cxx11::string::operator=((string *)&key_str,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5e3,
               "Expected: key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, path) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"key_str.c_str()","ext_path_str.c_str()",key_str._M_dataplus._M_p
             ,ext_path_str._M_dataplus._M_p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_140);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5e4,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_140);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&key_str);
  std::__cxx11::string::~string((string *)&ext_path_str);
  std::__cxx11::string::~string((string *)&ext_str);
  std::__cxx11::string::~string((string *)&path);
  cfd::core::ExtPrivkey::~ExtPrivkey(&privkey);
  std::__cxx11::string::~string((string *)&extkey);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, GetExtPrivkeyInformation) {
  std::string extkey = "tprv8fFXTTUs3e5Q1CGAPnabXXFUJor2q2jXo3VCceUggUNGMgCQ4FsLgPemcq2FPym15qZ2kjNx414T3Ypha1gAL3GHUH3uN3xDB3ymD434uWh";
  ExtPrivkey privkey(extkey);
  std::string path = "0'/1";
  std::string ext_str = "[f4a831a2]";
  std::string ext_path_str = "[f4a831a2/" + path + "]";
  std::string key_str;

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, ""));
  EXPECT_STREQ(key_str.c_str(), ext_str.c_str());

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, path));
  EXPECT_STREQ(key_str.c_str(), ext_path_str.c_str());
}